

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O3

void wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>::scan
               (Replacer *self,Expression **currp)

{
  char *__function;
  Expression *currp_00;
  Expression *pEVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_> *pPVar5;
  _func_void_Replacer_ptr_Expression_ptr_ptr *local_40;
  Expression *local_38;
  
  pEVar1 = *currp;
  switch(pEVar1->_id) {
  case InvalidId:
  case NumExpressionIds:
    handle_unreachable("unexpected expression type",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-delegations-fields.def"
                       ,0xb0);
  case BlockId:
    pPVar5 = &(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>).
              super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>;
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&pPVar5->super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitBlock,currp);
    if (pEVar1->_id != BlockId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Block]";
      goto LAB_0079b3fc;
    }
    uVar2 = (uint)pEVar1[2].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar1[2].type.id <= uVar3 - 2) {
LAB_0079b07f:
          __assert_fail("index < usedElements",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/mixed_arena.h"
                        ,0xbc,
                        "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                       );
        }
        Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
                  (&pPVar5->super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,scan,
                   (Expression **)(*(long *)(pEVar1 + 2) + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case IfId:
    pPVar5 = &(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>).
              super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>;
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&pPVar5->super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitIf,currp);
    if (pEVar1->_id != IfId) {
      __function = "T *wasm::Expression::cast() [T = wasm::If]";
      goto LAB_0079b3fc;
    }
    local_38 = pEVar1 + 2;
    local_40 = scan;
    if (*(long *)(pEVar1 + 2) != 0) {
      SmallVector<wasm::Walker<wasm::MemoryPacking::replaceSegmentOps(wasm::Module*,std::unordered_map<wasm::Expression*,std::function<wasm::Expression*(wasm::Function*)>,std::hash<wasm::Expression*>,std::equal_to<wasm::Expression*>,std::allocator<std::pair<wasm::Expression*const,std::function<wasm::Expression*(wasm::Function*)>>>>&)::Replacer,wasm::Visitor<wasm::MemoryPacking::replaceSegmentOps(wasm::Module*,std::unordered_map<wasm::Expression*,std::function<wasm::Expression*(wasm::Function*)>,std::hash<wasm::Expression*>,std::equal_to<wasm::Expression*>,std::allocator<std::pair<wasm::Expression*const,std::function<wasm::Expression*(wasm::Function*)>>>>&)::Replacer,void>>::Task,10ul>
      ::
      emplace_back<void(*&)(wasm::MemoryPacking::replaceSegmentOps(wasm::Module*,std::unordered_map<wasm::Expression*,std::function<wasm::Expression*(wasm::Function*)>,std::hash<wasm::Expression*>,std::equal_to<wasm::Expression*>,std::allocator<std::pair<wasm::Expression*const,std::function<wasm::Expression*(wasm::Function*)>>>>&)::Replacer*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<wasm::MemoryPacking::replaceSegmentOps(wasm::Module*,std::unordered_map<wasm::Expression*,std::function<wasm::Expression*(wasm::Function*)>,std::hash<wasm::Expression*>,std::equal_to<wasm::Expression*>,std::allocator<std::pair<wasm::Expression*const,std::function<wasm::Expression*(wasm::Function*)>>>>&)::Replacer,wasm::Visitor<wasm::MemoryPacking::replaceSegmentOps(wasm::Module*,std::unordered_map<wasm::Expression*,std::function<wasm::Expression*(wasm::Function*)>,std::hash<wasm::Expression*>,std::equal_to<wasm::Expression*>,std::allocator<std::pair<wasm::Expression*const,std::function<wasm::Expression*(wasm::Function*)>>>>&)::Replacer,void>>::Task,10ul>
                  *)&(self->
                     super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>).
                     super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                     super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>.stack,&local_40,
                 (Expression ***)&local_38);
    }
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&pPVar5->super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,scan,
               (Expression **)&pEVar1[1].type);
    pEVar1 = pEVar1 + 1;
    goto LAB_0079afc4;
  case LoopId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitLoop,currp);
    if (pEVar1->_id != LoopId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Loop]";
      goto LAB_0079b3fc;
    }
    goto LAB_0079ac26;
  case BreakId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitBreak,currp);
    if (pEVar1->_id != BreakId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Break]";
      goto LAB_0079b3fc;
    }
    local_38 = (Expression *)&pEVar1[2].type;
    local_40 = scan;
    if (pEVar1[2].type.id != 0) {
      SmallVector<wasm::Walker<wasm::MemoryPacking::replaceSegmentOps(wasm::Module*,std::unordered_map<wasm::Expression*,std::function<wasm::Expression*(wasm::Function*)>,std::hash<wasm::Expression*>,std::equal_to<wasm::Expression*>,std::allocator<std::pair<wasm::Expression*const,std::function<wasm::Expression*(wasm::Function*)>>>>&)::Replacer,wasm::Visitor<wasm::MemoryPacking::replaceSegmentOps(wasm::Module*,std::unordered_map<wasm::Expression*,std::function<wasm::Expression*(wasm::Function*)>,std::hash<wasm::Expression*>,std::equal_to<wasm::Expression*>,std::allocator<std::pair<wasm::Expression*const,std::function<wasm::Expression*(wasm::Function*)>>>>&)::Replacer,void>>::Task,10ul>
      ::
      emplace_back<void(*&)(wasm::MemoryPacking::replaceSegmentOps(wasm::Module*,std::unordered_map<wasm::Expression*,std::function<wasm::Expression*(wasm::Function*)>,std::hash<wasm::Expression*>,std::equal_to<wasm::Expression*>,std::allocator<std::pair<wasm::Expression*const,std::function<wasm::Expression*(wasm::Function*)>>>>&)::Replacer*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<wasm::MemoryPacking::replaceSegmentOps(wasm::Module*,std::unordered_map<wasm::Expression*,std::function<wasm::Expression*(wasm::Function*)>,std::hash<wasm::Expression*>,std::equal_to<wasm::Expression*>,std::allocator<std::pair<wasm::Expression*const,std::function<wasm::Expression*(wasm::Function*)>>>>&)::Replacer,wasm::Visitor<wasm::MemoryPacking::replaceSegmentOps(wasm::Module*,std::unordered_map<wasm::Expression*,std::function<wasm::Expression*(wasm::Function*)>,std::hash<wasm::Expression*>,std::equal_to<wasm::Expression*>,std::allocator<std::pair<wasm::Expression*const,std::function<wasm::Expression*(wasm::Function*)>>>>&)::Replacer,void>>::Task,10ul>
                  *)&(self->
                     super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>).
                     super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                     super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>.stack,&local_40,
                 (Expression ***)&local_38);
    }
    local_38 = pEVar1 + 2;
    if (*(long *)(pEVar1 + 2) == 0) {
      return;
    }
    goto LAB_0079a83b;
  case SwitchId:
    pPVar5 = &(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>).
              super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>;
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&pPVar5->super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitSwitch,currp);
    if (pEVar1->_id != SwitchId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Switch]";
      goto LAB_0079b3fc;
    }
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&pPVar5->super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,scan,
               (Expression **)&pEVar1[4].type);
    local_38 = pEVar1 + 4;
    lVar4 = *(long *)(pEVar1 + 4);
    goto joined_r0x0079a5c9;
  case CallId:
    pPVar5 = &(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>).
              super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>;
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&pPVar5->super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitCall,currp);
    if (pEVar1->_id != CallId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Call]";
      goto LAB_0079b3fc;
    }
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar1[1].type.id <= uVar3 - 2) goto LAB_0079b07f;
        Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
                  (&pPVar5->super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,scan,
                   (Expression **)(*(long *)(pEVar1 + 1) + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case CallIndirectId:
    pPVar5 = &(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>).
              super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>;
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&pPVar5->super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitCallIndirect,currp);
    if (pEVar1->_id != CallIndirectId) {
      __function = "T *wasm::Expression::cast() [T = wasm::CallIndirect]";
      goto LAB_0079b3fc;
    }
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&pPVar5->super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,scan,
               (Expression **)&pEVar1[3].type);
    if (0 < (int)(uint)*(undefined8 *)(pEVar1 + 2)) {
      uVar3 = (ulong)((uint)*(undefined8 *)(pEVar1 + 2) & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (*(ulong *)(pEVar1 + 2) <= uVar3 - 2) goto LAB_0079b07f;
        Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
                  (&pPVar5->super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,scan,
                   (Expression **)(pEVar1[1].type.id + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case LocalGetId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitLocalGet,currp);
    if (pEVar1->_id != LocalGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::LocalGet]";
      goto LAB_0079b3fc;
    }
    break;
  case LocalSetId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitLocalSet,currp);
    if (pEVar1->_id != LocalSetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::LocalSet]";
      goto LAB_0079b3fc;
    }
    goto LAB_0079ad28;
  case GlobalGetId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitGlobalGet,currp);
    if (pEVar1->_id != GlobalGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::GlobalGet]";
      goto LAB_0079b3fc;
    }
    break;
  case GlobalSetId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitGlobalSet,currp);
    if (pEVar1->_id != GlobalSetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::GlobalSet]";
      goto LAB_0079b3fc;
    }
    goto LAB_0079ac26;
  case LoadId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitLoad,currp);
    if (pEVar1->_id == LoadId) {
      pEVar1 = pEVar1 + 3;
      goto LAB_0079afc4;
    }
    __function = "T *wasm::Expression::cast() [T = wasm::Load]";
    goto LAB_0079b3fc;
  case StoreId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitStore,currp);
    if (pEVar1->_id != StoreId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Store]";
      goto LAB_0079b3fc;
    }
    goto LAB_0079aced;
  case ConstId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitConst,currp);
    if (pEVar1->_id != ConstId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Const]";
      goto LAB_0079b3fc;
    }
    break;
  case UnaryId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitUnary,currp);
    if (pEVar1->_id != UnaryId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Unary]";
      goto LAB_0079b3fc;
    }
    goto LAB_0079ad28;
  case BinaryId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitBinary,currp);
    if (pEVar1->_id != BinaryId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Binary]";
      goto LAB_0079b3fc;
    }
    goto LAB_0079afa4;
  case SelectId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitSelect,currp);
    if (pEVar1->_id != SelectId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Select]";
      goto LAB_0079b3fc;
    }
    goto LAB_0079a91a;
  case DropId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitDrop,currp);
    if (pEVar1->_id != DropId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Drop]";
      goto LAB_0079b3fc;
    }
    goto LAB_0079af78;
  case ReturnId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitReturn,currp);
    if (pEVar1->_id != ReturnId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Return]";
      goto LAB_0079b3fc;
    }
    goto LAB_0079a5c0;
  case MemorySizeId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitMemorySize,currp);
    if (pEVar1->_id != MemorySizeId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemorySize]";
      goto LAB_0079b3fc;
    }
    break;
  case MemoryGrowId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitMemoryGrow,currp);
    if (pEVar1->_id != MemoryGrowId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemoryGrow]";
      goto LAB_0079b3fc;
    }
    goto LAB_0079af78;
  case NopId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitNop,currp);
    if (pEVar1->_id != NopId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Nop]";
      goto LAB_0079b3fc;
    }
    break;
  case UnreachableId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitUnreachable,currp);
    if (pEVar1->_id != UnreachableId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Unreachable]";
      goto LAB_0079b3fc;
    }
    break;
  case AtomicRMWId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitAtomicRMW,currp);
    if (pEVar1->_id != AtomicRMWId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicRMW]";
      goto LAB_0079b3fc;
    }
    goto LAB_0079add3;
  case AtomicCmpxchgId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitAtomicCmpxchg,currp);
    if (pEVar1->_id != AtomicCmpxchgId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicCmpxchg]";
      goto LAB_0079b3fc;
    }
    goto LAB_0079adb9;
  case AtomicWaitId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitAtomicWait,currp);
    if (pEVar1->_id != AtomicWaitId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicWait]";
      goto LAB_0079b3fc;
    }
    goto LAB_0079a447;
  case AtomicNotifyId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitAtomicNotify,currp);
    if (pEVar1->_id != AtomicNotifyId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicNotify]";
      goto LAB_0079b3fc;
    }
    goto LAB_0079afa4;
  case AtomicFenceId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitAtomicFence,currp);
    if (pEVar1->_id != AtomicFenceId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicFence]";
      goto LAB_0079b3fc;
    }
    break;
  case SIMDExtractId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitSIMDExtract,currp);
    if (pEVar1->_id != SIMDExtractId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDExtract]";
      goto LAB_0079b3fc;
    }
    goto LAB_0079ad28;
  case SIMDReplaceId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitSIMDReplace,currp);
    if (pEVar1->_id != SIMDReplaceId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDReplace]";
      goto LAB_0079b3fc;
    }
    currp_00 = (Expression *)&pEVar1[2].type;
    goto LAB_0079afaf;
  case SIMDShuffleId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitSIMDShuffle,currp);
    if (pEVar1->_id != SIMDShuffleId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDShuffle]";
      goto LAB_0079b3fc;
    }
    goto LAB_0079af16;
  case SIMDTernaryId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitSIMDTernary,currp);
    if (pEVar1->_id != SIMDTernaryId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDTernary]";
      goto LAB_0079b3fc;
    }
    goto LAB_0079a447;
  case SIMDShiftId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitSIMDShift,currp);
    if (pEVar1->_id != SIMDShiftId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDShift]";
      goto LAB_0079b3fc;
    }
    goto LAB_0079afa4;
  case SIMDLoadId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitSIMDLoad,currp);
    if (pEVar1->_id != SIMDLoadId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDLoad]";
      goto LAB_0079b3fc;
    }
    goto LAB_0079ab4f;
  case SIMDLoadStoreLaneId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitSIMDLoadStoreLane,currp);
    if (pEVar1->_id != SIMDLoadStoreLaneId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDLoadStoreLane]";
      goto LAB_0079b3fc;
    }
LAB_0079aced:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,scan,
               (Expression **)&pEVar1[3].type);
    pEVar1 = pEVar1 + 3;
    goto LAB_0079afc4;
  case MemoryInitId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitMemoryInit,currp);
    if (pEVar1->_id != MemoryInitId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemoryInit]";
      goto LAB_0079b3fc;
    }
LAB_0079adb9:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,scan,
               (Expression **)(pEVar1 + 3));
    goto LAB_0079add3;
  case DataDropId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitDataDrop,currp);
    if (pEVar1->_id != DataDropId) {
      __function = "T *wasm::Expression::cast() [T = wasm::DataDrop]";
      goto LAB_0079b3fc;
    }
    break;
  case MemoryCopyId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitMemoryCopy,currp);
    if (pEVar1->_id != MemoryCopyId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemoryCopy]";
      goto LAB_0079b3fc;
    }
    goto LAB_0079a91a;
  case MemoryFillId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitMemoryFill,currp);
    if (pEVar1->_id != MemoryFillId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemoryFill]";
      goto LAB_0079b3fc;
    }
    goto LAB_0079a91a;
  case PopId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitPop,currp);
    if (pEVar1->_id != PopId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Pop]";
      goto LAB_0079b3fc;
    }
    break;
  case RefNullId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitRefNull,currp);
    if (pEVar1->_id != RefNullId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefNull]";
      goto LAB_0079b3fc;
    }
    break;
  case RefIsNullId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitRefIsNull,currp);
    if (pEVar1->_id != RefIsNullId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefIsNull]";
      goto LAB_0079b3fc;
    }
    goto LAB_0079af78;
  case RefFuncId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitRefFunc,currp);
    if (pEVar1->_id != RefFuncId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefFunc]";
      goto LAB_0079b3fc;
    }
    break;
  case RefEqId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitRefEq,currp);
    if (pEVar1->_id != RefEqId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefEq]";
      goto LAB_0079b3fc;
    }
    goto LAB_0079af16;
  case TableGetId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitTableGet,currp);
    if (pEVar1->_id != TableGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableGet]";
      goto LAB_0079b3fc;
    }
    goto LAB_0079ac26;
  case TableSetId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitTableSet,currp);
    if (pEVar1->_id != TableSetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableSet]";
      goto LAB_0079b3fc;
    }
    goto LAB_0079add3;
  case TableSizeId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitTableSize,currp);
    if (pEVar1->_id != TableSizeId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableSize]";
      goto LAB_0079b3fc;
    }
    break;
  case TableGrowId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitTableGrow,currp);
    if (pEVar1->_id != TableGrowId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableGrow]";
      goto LAB_0079b3fc;
    }
LAB_0079add3:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,scan,
               (Expression **)&pEVar1[2].type);
    pEVar1 = pEVar1 + 2;
    goto LAB_0079afc4;
  case TryId:
    pPVar5 = &(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>).
              super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>;
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&pPVar5->super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitTry,currp);
    if (pEVar1->_id != TryId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Try]";
      goto LAB_0079b3fc;
    }
    if (0 < (int)(uint)*(undefined8 *)(pEVar1 + 5)) {
      uVar3 = (ulong)((uint)*(undefined8 *)(pEVar1 + 5) & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (*(ulong *)(pEVar1 + 5) <= uVar3 - 2) goto LAB_0079b07f;
        Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
                  (&pPVar5->super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,scan,
                   (Expression **)(pEVar1[4].type.id + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
LAB_0079ac26:
    pEVar1 = pEVar1 + 2;
    goto LAB_0079afc4;
  case ThrowId:
    pPVar5 = &(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>).
              super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>;
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&pPVar5->super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitThrow,currp);
    if (pEVar1->_id != ThrowId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Throw]";
      goto LAB_0079b3fc;
    }
    uVar2 = (uint)pEVar1[2].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar1[2].type.id <= uVar3 - 2) goto LAB_0079b07f;
        Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
                  (&pPVar5->super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,scan,
                   (Expression **)(*(long *)(pEVar1 + 2) + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case RethrowId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitRethrow,currp);
    if (pEVar1->_id != RethrowId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Rethrow]";
      goto LAB_0079b3fc;
    }
    break;
  case TupleMakeId:
    pPVar5 = &(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>).
              super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>;
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&pPVar5->super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitTupleMake,currp);
    if (pEVar1->_id != TupleMakeId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TupleMake]";
      goto LAB_0079b3fc;
    }
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar1[1].type.id <= uVar3 - 2) goto LAB_0079b07f;
        Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
                  (&pPVar5->super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,scan,
                   (Expression **)(*(long *)(pEVar1 + 1) + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case TupleExtractId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitTupleExtract,currp);
    if (pEVar1->_id != TupleExtractId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TupleExtract]";
      goto LAB_0079b3fc;
    }
    goto LAB_0079af78;
  case I31NewId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitI31New,currp);
    if (pEVar1->_id != I31NewId) {
      __function = "T *wasm::Expression::cast() [T = wasm::I31New]";
      goto LAB_0079b3fc;
    }
    goto LAB_0079af78;
  case I31GetId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitI31Get,currp);
    if (pEVar1->_id != I31GetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::I31Get]";
      goto LAB_0079b3fc;
    }
    goto LAB_0079af78;
  case CallRefId:
    pPVar5 = &(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>).
              super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>;
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&pPVar5->super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitCallRef,currp);
    if (pEVar1->_id != CallRefId) {
      __function = "T *wasm::Expression::cast() [T = wasm::CallRef]";
      goto LAB_0079b3fc;
    }
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&pPVar5->super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,scan,
               (Expression **)(pEVar1 + 3));
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar1[1].type.id <= uVar3 - 2) goto LAB_0079b07f;
        Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
                  (&pPVar5->super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,scan,
                   (Expression **)(*(long *)(pEVar1 + 1) + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case RefTestId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitRefTest,currp);
    if (pEVar1->_id != RefTestId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefTest]";
      goto LAB_0079b3fc;
    }
    goto LAB_0079af78;
  case RefCastId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitRefCast,currp);
    if (pEVar1->_id != RefCastId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefCast]";
      goto LAB_0079b3fc;
    }
    goto LAB_0079af78;
  case BrOnId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitBrOn,currp);
    if (pEVar1->_id != BrOnId) {
      __function = "T *wasm::Expression::cast() [T = wasm::BrOn]";
      goto LAB_0079b3fc;
    }
LAB_0079ab4f:
    pEVar1 = (Expression *)&pEVar1[2].type;
    goto LAB_0079afc4;
  case StructNewId:
    pPVar5 = &(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>).
              super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>;
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&pPVar5->super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitStructNew,currp);
    if (pEVar1->_id != StructNewId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StructNew]";
      goto LAB_0079b3fc;
    }
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar1[1].type.id <= uVar3 - 2) goto LAB_0079b07f;
        Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
                  (&pPVar5->super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,scan,
                   (Expression **)(*(long *)(pEVar1 + 1) + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case StructGetId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitStructGet,currp);
    if (pEVar1->_id != StructGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StructGet]";
      goto LAB_0079b3fc;
    }
    goto LAB_0079ad28;
  case StructSetId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitStructSet,currp);
    if (pEVar1->_id != StructSetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StructSet]";
      goto LAB_0079b3fc;
    }
    goto LAB_0079afa4;
  case ArrayNewId:
    pPVar5 = &(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>).
              super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>;
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&pPVar5->super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitArrayNew,currp);
    if (pEVar1->_id != ArrayNewId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayNew]";
      goto LAB_0079b3fc;
    }
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&pPVar5->super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,scan,
               (Expression **)&pEVar1[1].type);
LAB_0079a5c0:
    local_38 = pEVar1 + 1;
    lVar4 = *(long *)(pEVar1 + 1);
joined_r0x0079a5c9:
    if (lVar4 != 0) {
LAB_0079a83b:
      local_40 = scan;
      SmallVector<wasm::Walker<wasm::MemoryPacking::replaceSegmentOps(wasm::Module*,std::unordered_map<wasm::Expression*,std::function<wasm::Expression*(wasm::Function*)>,std::hash<wasm::Expression*>,std::equal_to<wasm::Expression*>,std::allocator<std::pair<wasm::Expression*const,std::function<wasm::Expression*(wasm::Function*)>>>>&)::Replacer,wasm::Visitor<wasm::MemoryPacking::replaceSegmentOps(wasm::Module*,std::unordered_map<wasm::Expression*,std::function<wasm::Expression*(wasm::Function*)>,std::hash<wasm::Expression*>,std::equal_to<wasm::Expression*>,std::allocator<std::pair<wasm::Expression*const,std::function<wasm::Expression*(wasm::Function*)>>>>&)::Replacer,void>>::Task,10ul>
      ::
      emplace_back<void(*&)(wasm::MemoryPacking::replaceSegmentOps(wasm::Module*,std::unordered_map<wasm::Expression*,std::function<wasm::Expression*(wasm::Function*)>,std::hash<wasm::Expression*>,std::equal_to<wasm::Expression*>,std::allocator<std::pair<wasm::Expression*const,std::function<wasm::Expression*(wasm::Function*)>>>>&)::Replacer*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<wasm::MemoryPacking::replaceSegmentOps(wasm::Module*,std::unordered_map<wasm::Expression*,std::function<wasm::Expression*(wasm::Function*)>,std::hash<wasm::Expression*>,std::equal_to<wasm::Expression*>,std::allocator<std::pair<wasm::Expression*const,std::function<wasm::Expression*(wasm::Function*)>>>>&)::Replacer,wasm::Visitor<wasm::MemoryPacking::replaceSegmentOps(wasm::Module*,std::unordered_map<wasm::Expression*,std::function<wasm::Expression*(wasm::Function*)>,std::hash<wasm::Expression*>,std::equal_to<wasm::Expression*>,std::allocator<std::pair<wasm::Expression*const,std::function<wasm::Expression*(wasm::Function*)>>>>&)::Replacer,void>>::Task,10ul>
                  *)&(self->
                     super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>).
                     super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                     super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>.stack,&local_40,
                 (Expression ***)&local_38);
    }
    break;
  case ArrayNewSegId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitArrayNewSeg,currp);
    if (pEVar1->_id != ArrayNewSegId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayNewSeg]";
      goto LAB_0079b3fc;
    }
    goto LAB_0079a670;
  case ArrayNewFixedId:
    pPVar5 = &(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>).
              super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>;
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&pPVar5->super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitArrayNewFixed,currp);
    if (pEVar1->_id != ArrayNewFixedId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayNewFixed]";
      goto LAB_0079b3fc;
    }
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar1[1].type.id <= uVar3 - 2) goto LAB_0079b07f;
        Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
                  (&pPVar5->super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,scan,
                   (Expression **)(*(long *)(pEVar1 + 1) + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case ArrayGetId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitArrayGet,currp);
    if (pEVar1->_id != ArrayGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayGet]";
      goto LAB_0079b3fc;
    }
    goto LAB_0079af16;
  case ArraySetId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitArraySet,currp);
    if (pEVar1->_id != ArraySetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArraySet]";
      goto LAB_0079b3fc;
    }
    goto LAB_0079a91a;
  case ArrayLenId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitArrayLen,currp);
    if (pEVar1->_id != ArrayLenId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayLen]";
      goto LAB_0079b3fc;
    }
    goto LAB_0079af78;
  case ArrayCopyId:
    pPVar5 = &(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>).
              super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>;
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&pPVar5->super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitArrayCopy,currp);
    if (pEVar1->_id != ArrayCopyId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayCopy]";
      goto LAB_0079b3fc;
    }
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&pPVar5->super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,scan,
               (Expression **)(pEVar1 + 3));
    goto LAB_0079a3e1;
  case ArrayFillId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitArrayFill,currp);
    if (pEVar1->_id != ArrayFillId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayFill]";
      goto LAB_0079b3fc;
    }
LAB_0079a3e1:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,scan,
               (Expression **)&pEVar1[2].type);
    goto LAB_0079a91a;
  case ArrayInitId:
    pPVar5 = &(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>).
              super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>;
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&pPVar5->super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitArrayInit,currp);
    if (pEVar1->_id != ArrayInitId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayInit]";
      goto LAB_0079b3fc;
    }
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&pPVar5->super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,scan,
               (Expression **)(pEVar1 + 4));
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&pPVar5->super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,scan,
               (Expression **)&pEVar1[3].type);
LAB_0079a670:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,scan,
               (Expression **)(pEVar1 + 3));
    pEVar1 = (Expression *)&pEVar1[2].type;
    goto LAB_0079afc4;
  case RefAsId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitRefAs,currp);
    if (pEVar1->_id != RefAsId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefAs]";
      goto LAB_0079b3fc;
    }
    goto LAB_0079ad28;
  case StringNewId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitStringNew,currp);
    if (pEVar1->_id == StringNewId) {
      local_38 = pEVar1 + 3;
      local_40 = scan;
      if (*(long *)(pEVar1 + 3) != 0) {
        SmallVector<wasm::Walker<wasm::MemoryPacking::replaceSegmentOps(wasm::Module*,std::unordered_map<wasm::Expression*,std::function<wasm::Expression*(wasm::Function*)>,std::hash<wasm::Expression*>,std::equal_to<wasm::Expression*>,std::allocator<std::pair<wasm::Expression*const,std::function<wasm::Expression*(wasm::Function*)>>>>&)::Replacer,wasm::Visitor<wasm::MemoryPacking::replaceSegmentOps(wasm::Module*,std::unordered_map<wasm::Expression*,std::function<wasm::Expression*(wasm::Function*)>,std::hash<wasm::Expression*>,std::equal_to<wasm::Expression*>,std::allocator<std::pair<wasm::Expression*const,std::function<wasm::Expression*(wasm::Function*)>>>>&)::Replacer,void>>::Task,10ul>
        ::
        emplace_back<void(*&)(wasm::MemoryPacking::replaceSegmentOps(wasm::Module*,std::unordered_map<wasm::Expression*,std::function<wasm::Expression*(wasm::Function*)>,std::hash<wasm::Expression*>,std::equal_to<wasm::Expression*>,std::allocator<std::pair<wasm::Expression*const,std::function<wasm::Expression*(wasm::Function*)>>>>&)::Replacer*,wasm::Expression**),wasm::Expression**&>
                  ((SmallVector<wasm::Walker<wasm::MemoryPacking::replaceSegmentOps(wasm::Module*,std::unordered_map<wasm::Expression*,std::function<wasm::Expression*(wasm::Function*)>,std::hash<wasm::Expression*>,std::equal_to<wasm::Expression*>,std::allocator<std::pair<wasm::Expression*const,std::function<wasm::Expression*(wasm::Function*)>>>>&)::Replacer,wasm::Visitor<wasm::MemoryPacking::replaceSegmentOps(wasm::Module*,std::unordered_map<wasm::Expression*,std::function<wasm::Expression*(wasm::Function*)>,std::hash<wasm::Expression*>,std::equal_to<wasm::Expression*>,std::allocator<std::pair<wasm::Expression*const,std::function<wasm::Expression*(wasm::Function*)>>>>&)::Replacer,void>>::Task,10ul>
                    *)&(self->
                       super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                       ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                       super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>.stack,&local_40,
                   (Expression ***)&local_38);
      }
      local_38 = (Expression *)&pEVar1[2].type;
      local_40 = scan;
      if (pEVar1[2].type.id != 0) {
        SmallVector<wasm::Walker<wasm::MemoryPacking::replaceSegmentOps(wasm::Module*,std::unordered_map<wasm::Expression*,std::function<wasm::Expression*(wasm::Function*)>,std::hash<wasm::Expression*>,std::equal_to<wasm::Expression*>,std::allocator<std::pair<wasm::Expression*const,std::function<wasm::Expression*(wasm::Function*)>>>>&)::Replacer,wasm::Visitor<wasm::MemoryPacking::replaceSegmentOps(wasm::Module*,std::unordered_map<wasm::Expression*,std::function<wasm::Expression*(wasm::Function*)>,std::hash<wasm::Expression*>,std::equal_to<wasm::Expression*>,std::allocator<std::pair<wasm::Expression*const,std::function<wasm::Expression*(wasm::Function*)>>>>&)::Replacer,void>>::Task,10ul>
        ::
        emplace_back<void(*&)(wasm::MemoryPacking::replaceSegmentOps(wasm::Module*,std::unordered_map<wasm::Expression*,std::function<wasm::Expression*(wasm::Function*)>,std::hash<wasm::Expression*>,std::equal_to<wasm::Expression*>,std::allocator<std::pair<wasm::Expression*const,std::function<wasm::Expression*(wasm::Function*)>>>>&)::Replacer*,wasm::Expression**),wasm::Expression**&>
                  ((SmallVector<wasm::Walker<wasm::MemoryPacking::replaceSegmentOps(wasm::Module*,std::unordered_map<wasm::Expression*,std::function<wasm::Expression*(wasm::Function*)>,std::hash<wasm::Expression*>,std::equal_to<wasm::Expression*>,std::allocator<std::pair<wasm::Expression*const,std::function<wasm::Expression*(wasm::Function*)>>>>&)::Replacer,wasm::Visitor<wasm::MemoryPacking::replaceSegmentOps(wasm::Module*,std::unordered_map<wasm::Expression*,std::function<wasm::Expression*(wasm::Function*)>,std::hash<wasm::Expression*>,std::equal_to<wasm::Expression*>,std::allocator<std::pair<wasm::Expression*const,std::function<wasm::Expression*(wasm::Function*)>>>>&)::Replacer,void>>::Task,10ul>
                    *)&(self->
                       super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                       ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                       super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>.stack,&local_40,
                   (Expression ***)&local_38);
      }
      local_38 = pEVar1 + 2;
      local_40 = scan;
      if (*(long *)(pEVar1 + 2) != 0) {
        SmallVector<wasm::Walker<wasm::MemoryPacking::replaceSegmentOps(wasm::Module*,std::unordered_map<wasm::Expression*,std::function<wasm::Expression*(wasm::Function*)>,std::hash<wasm::Expression*>,std::equal_to<wasm::Expression*>,std::allocator<std::pair<wasm::Expression*const,std::function<wasm::Expression*(wasm::Function*)>>>>&)::Replacer,wasm::Visitor<wasm::MemoryPacking::replaceSegmentOps(wasm::Module*,std::unordered_map<wasm::Expression*,std::function<wasm::Expression*(wasm::Function*)>,std::hash<wasm::Expression*>,std::equal_to<wasm::Expression*>,std::allocator<std::pair<wasm::Expression*const,std::function<wasm::Expression*(wasm::Function*)>>>>&)::Replacer,void>>::Task,10ul>
        ::
        emplace_back<void(*&)(wasm::MemoryPacking::replaceSegmentOps(wasm::Module*,std::unordered_map<wasm::Expression*,std::function<wasm::Expression*(wasm::Function*)>,std::hash<wasm::Expression*>,std::equal_to<wasm::Expression*>,std::allocator<std::pair<wasm::Expression*const,std::function<wasm::Expression*(wasm::Function*)>>>>&)::Replacer*,wasm::Expression**),wasm::Expression**&>
                  ((SmallVector<wasm::Walker<wasm::MemoryPacking::replaceSegmentOps(wasm::Module*,std::unordered_map<wasm::Expression*,std::function<wasm::Expression*(wasm::Function*)>,std::hash<wasm::Expression*>,std::equal_to<wasm::Expression*>,std::allocator<std::pair<wasm::Expression*const,std::function<wasm::Expression*(wasm::Function*)>>>>&)::Replacer,wasm::Visitor<wasm::MemoryPacking::replaceSegmentOps(wasm::Module*,std::unordered_map<wasm::Expression*,std::function<wasm::Expression*(wasm::Function*)>,std::hash<wasm::Expression*>,std::equal_to<wasm::Expression*>,std::allocator<std::pair<wasm::Expression*const,std::function<wasm::Expression*(wasm::Function*)>>>>&)::Replacer,void>>::Task,10ul>
                    *)&(self->
                       super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                       ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                       super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>.stack,&local_40,
                   (Expression ***)&local_38);
      }
      pEVar1 = (Expression *)&pEVar1[1].type;
      goto LAB_0079afc4;
    }
    __function = "T *wasm::Expression::cast() [T = wasm::StringNew]";
    goto LAB_0079b3fc;
  case StringConstId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitStringConst,currp);
    if (pEVar1->_id != StringConstId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringConst]";
      goto LAB_0079b3fc;
    }
    break;
  case StringMeasureId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitStringMeasure,currp);
    if (pEVar1->_id != StringMeasureId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringMeasure]";
      goto LAB_0079b3fc;
    }
    goto LAB_0079ad28;
  case StringEncodeId:
    pPVar5 = &(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>).
              super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>;
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&pPVar5->super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitStringEncode,currp);
    if (pEVar1->_id == StringEncodeId) {
      local_38 = (Expression *)&pEVar1[2].type;
      local_40 = scan;
      if (pEVar1[2].type.id != 0) {
        SmallVector<wasm::Walker<wasm::MemoryPacking::replaceSegmentOps(wasm::Module*,std::unordered_map<wasm::Expression*,std::function<wasm::Expression*(wasm::Function*)>,std::hash<wasm::Expression*>,std::equal_to<wasm::Expression*>,std::allocator<std::pair<wasm::Expression*const,std::function<wasm::Expression*(wasm::Function*)>>>>&)::Replacer,wasm::Visitor<wasm::MemoryPacking::replaceSegmentOps(wasm::Module*,std::unordered_map<wasm::Expression*,std::function<wasm::Expression*(wasm::Function*)>,std::hash<wasm::Expression*>,std::equal_to<wasm::Expression*>,std::allocator<std::pair<wasm::Expression*const,std::function<wasm::Expression*(wasm::Function*)>>>>&)::Replacer,void>>::Task,10ul>
        ::
        emplace_back<void(*&)(wasm::MemoryPacking::replaceSegmentOps(wasm::Module*,std::unordered_map<wasm::Expression*,std::function<wasm::Expression*(wasm::Function*)>,std::hash<wasm::Expression*>,std::equal_to<wasm::Expression*>,std::allocator<std::pair<wasm::Expression*const,std::function<wasm::Expression*(wasm::Function*)>>>>&)::Replacer*,wasm::Expression**),wasm::Expression**&>
                  ((SmallVector<wasm::Walker<wasm::MemoryPacking::replaceSegmentOps(wasm::Module*,std::unordered_map<wasm::Expression*,std::function<wasm::Expression*(wasm::Function*)>,std::hash<wasm::Expression*>,std::equal_to<wasm::Expression*>,std::allocator<std::pair<wasm::Expression*const,std::function<wasm::Expression*(wasm::Function*)>>>>&)::Replacer,wasm::Visitor<wasm::MemoryPacking::replaceSegmentOps(wasm::Module*,std::unordered_map<wasm::Expression*,std::function<wasm::Expression*(wasm::Function*)>,std::hash<wasm::Expression*>,std::equal_to<wasm::Expression*>,std::allocator<std::pair<wasm::Expression*const,std::function<wasm::Expression*(wasm::Function*)>>>>&)::Replacer,void>>::Task,10ul>
                    *)&(self->
                       super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                       ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                       super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>.stack,&local_40,
                   (Expression ***)&local_38);
      }
      Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
                (&pPVar5->super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,scan,
                 (Expression **)(pEVar1 + 2));
      pEVar1 = (Expression *)&pEVar1[1].type;
      goto LAB_0079afc4;
    }
    __function = "T *wasm::Expression::cast() [T = wasm::StringEncode]";
LAB_0079b3fc:
    __assert_fail("int(_id) == int(T::SpecificId)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm.h"
                  ,0x314,__function);
  case StringConcatId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitStringConcat,currp);
    if (pEVar1->_id != StringConcatId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringConcat]";
      goto LAB_0079b3fc;
    }
    goto LAB_0079af16;
  case StringEqId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitStringEq,currp);
    if (pEVar1->_id != StringEqId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringEq]";
      goto LAB_0079b3fc;
    }
    goto LAB_0079afa4;
  case StringAsId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitStringAs,currp);
    if (pEVar1->_id != StringAsId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringAs]";
      goto LAB_0079b3fc;
    }
LAB_0079ad28:
    pEVar1 = (Expression *)&pEVar1[1].type;
    goto LAB_0079afc4;
  case StringWTF8AdvanceId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitStringWTF8Advance,currp);
    if (pEVar1->_id != StringWTF8AdvanceId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringWTF8Advance]";
      goto LAB_0079b3fc;
    }
LAB_0079a91a:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,scan,
               (Expression **)(pEVar1 + 2));
    goto LAB_0079af16;
  case StringWTF16GetId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitStringWTF16Get,currp);
    if (pEVar1->_id != StringWTF16GetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringWTF16Get]";
      goto LAB_0079b3fc;
    }
    goto LAB_0079af16;
  case StringIterNextId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitStringIterNext,currp);
    if (pEVar1->_id != StringIterNextId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringIterNext]";
      goto LAB_0079b3fc;
    }
LAB_0079af78:
    pEVar1 = pEVar1 + 1;
LAB_0079afc4:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,scan,(Expression **)pEVar1);
    return;
  case StringIterMoveId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitStringIterMove,currp);
    if (pEVar1->_id != StringIterMoveId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringIterMove]";
      goto LAB_0079b3fc;
    }
LAB_0079afa4:
    currp_00 = pEVar1 + 2;
LAB_0079afaf:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,scan,(Expression **)currp_00)
    ;
    pEVar1 = (Expression *)&pEVar1[1].type;
    goto LAB_0079afc4;
  case StringSliceWTFId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitStringSliceWTF,currp);
    if (pEVar1->_id != StringSliceWTFId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringSliceWTF]";
      goto LAB_0079b3fc;
    }
LAB_0079a447:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,scan,
               (Expression **)&pEVar1[2].type);
    currp_00 = pEVar1 + 2;
    goto LAB_0079afaf;
  case StringSliceIterId:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,
               Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::doVisitStringSliceIter,currp);
    if (pEVar1->_id != StringSliceIterId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringSliceIter]";
      goto LAB_0079b3fc;
    }
LAB_0079af16:
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::pushTask
              (&(self->super_WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>
                ).super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>.
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,scan,
               (Expression **)&pEVar1[1].type);
    pEVar1 = pEVar1 + 1;
    goto LAB_0079afc4;
  }
  return;
}

Assistant:

static void scan(SubType* self, Expression** currp) {
    Expression* curr = *currp;

#define DELEGATE_ID curr->_id

#define DELEGATE_START(id)                                                     \
  self->pushTask(SubType::doVisit##id, currp);                                 \
  [[maybe_unused]] auto* cast = curr->cast<id>();

#define DELEGATE_GET_FIELD(id, field) cast->field

#define DELEGATE_FIELD_CHILD(id, field)                                        \
  self->pushTask(SubType::scan, &cast->field);

#define DELEGATE_FIELD_OPTIONAL_CHILD(id, field)                               \
  self->maybePushTask(SubType::scan, &cast->field);

#define DELEGATE_FIELD_INT(id, field)
#define DELEGATE_FIELD_INT_ARRAY(id, field)
#define DELEGATE_FIELD_LITERAL(id, field)
#define DELEGATE_FIELD_NAME(id, field)
#define DELEGATE_FIELD_NAME_VECTOR(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_DEF(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_USE(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_USE_VECTOR(id, field)
#define DELEGATE_FIELD_TYPE(id, field)
#define DELEGATE_FIELD_HEAPTYPE(id, field)
#define DELEGATE_FIELD_ADDRESS(id, field)

#include "wasm-delegations-fields.def"
  }